

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::AllocateLiteralRegexArray(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  Type *pTVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  RegexPattern **literalRegexes;
  TrackAllocData local_40;
  uint local_14;
  FunctionBody *pFStack_10;
  uint32 literalRegexCount;
  FunctionBody *this_local;
  
  pFStack_10 = this;
  pTVar3 = GetLiteralRegexes(this);
  if (pTVar3 != (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1982,"(!this->GetLiteralRegexes())","!this->GetLiteralRegexes()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_14 = GetLiteralRegexCount(this);
  if (local_14 != 0) {
    pRVar5 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&UnifiedRegex::RegexPattern*::typeinfo,0,(ulong)local_14,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1989);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
    literalRegexes =
         Memory::AllocateArray<Memory::Recycler,UnifiedRegex::RegexPattern*,false>
                   ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)local_14);
    SetLiteralRegexs(this,literalRegexes);
  }
  return;
}

Assistant:

void FunctionBody::AllocateLiteralRegexArray()
    {
        Assert(!this->GetLiteralRegexes());
        uint32 literalRegexCount = GetLiteralRegexCount();
        if (literalRegexCount == 0)
        {
            return;
        }

        this->SetLiteralRegexs(RecyclerNewArrayZ(m_scriptContext->GetRecycler(), UnifiedRegex::RegexPattern *, literalRegexCount));
    }